

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

GlobalBailOutRecordDataRow * __thiscall
Memory::
AllocateArray<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>>,GlobalBailOutRecordDataRow,false>
          (Memory *this,
          AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_> *allocator,
          offset_in_AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_>_to_subr
          AllocFunc,size_t count)

{
  GlobalBailOutRecordDataRow *pGVar1;
  
  pGVar1 = (GlobalBailOutRecordDataRow *)
           new__<NativeCodeData::AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>>>
                     (-(ulong)(count >> 0x3c != 0) | count << 4,
                      (AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_> *)this,
                      (offset_in_AllocatorNoFixup<NativeCodeData::Array<GlobalBailOutRecordDataRow>_>_to_subr
                       )allocator);
  return pGVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}